

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O2

parser_node * amrex::parser_ast_dup(amrex_parser *my_parser,parser_node *node,int move)

{
  parser_nvp pVar1;
  size_t sVar2;
  parser_node *ppVar3;
  parser_node *ppVar4;
  parser_node_t pVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  switch(node->type) {
  case PARSER_NUMBER:
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar4->r;
    uVar6 = *(undefined4 *)&node->field_0x4;
    ppVar3 = node->l;
    ppVar4->type = node->type;
    *(undefined4 *)&ppVar4->field_0x4 = uVar6;
    ppVar4->l = ppVar3;
    break;
  case PARSER_SYMBOL:
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar4->rip;
    ppVar4->r = node->r;
    uVar6 = *(undefined4 *)&node->field_0x4;
    ppVar3 = node->l;
    ppVar4->type = node->type;
    *(undefined4 *)&ppVar4->field_0x4 = uVar6;
    ppVar4->l = ppVar3;
    sVar2 = strlen((char *)node->l);
    ppVar3 = (parser_node *)my_parser->p_free;
    my_parser->p_free = (void *)((long)&ppVar3->r + (sVar2 & 0xfffffffffffffff0));
    ppVar4->l = ppVar3;
    strcpy((char *)ppVar3,(char *)node->l);
    break;
  case PARSER_ADD:
  case PARSER_SUB:
  case PARSER_MUL:
  case PARSER_DIV:
  case PARSER_LIST:
  case PARSER_ADD_PP:
  case PARSER_SUB_PP:
  case PARSER_MUL_PP:
  case PARSER_DIV_PP:
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar4[1].l;
    uVar6 = *(undefined4 *)&node->field_0x24;
    ppVar4->rip = node->rip;
    *(undefined4 *)&ppVar4->field_0x24 = uVar6;
    goto LAB_006c78b4;
  case PARSER_NEG:
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar4[1].l;
    uVar6 = *(undefined4 *)&node->field_0x24;
    ppVar4->rip = node->rip;
    *(undefined4 *)&ppVar4->field_0x24 = uVar6;
    pVar5 = node->type;
    uVar6 = *(undefined4 *)&node->field_0x4;
    ppVar3 = node->l;
    pVar1 = node->lvp;
    ppVar4->r = node->r;
    ppVar4->lvp = pVar1;
    ppVar4->type = pVar5;
    *(undefined4 *)&ppVar4->field_0x4 = uVar6;
    ppVar4->l = ppVar3;
    ppVar3 = parser_ast_dup(my_parser,node->l,move);
    ppVar4->l = ppVar3;
    ppVar4->r = (parser_node *)0x0;
    break;
  case PARSER_F1:
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar4->rip;
    ppVar4->r = node->r;
    pVar5 = node->type;
    uVar6 = *(undefined4 *)&node->field_0x4;
    uVar7 = *(undefined4 *)&node->l;
    uVar8 = *(undefined4 *)((long)&node->l + 4);
    goto LAB_006c7a3d;
  case PARSER_F2:
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar4->rip;
LAB_006c78b4:
    pVar5 = node->type;
    uVar6 = *(undefined4 *)&node->field_0x4;
    uVar7 = *(undefined4 *)&node->l;
    uVar8 = *(undefined4 *)((long)&node->l + 4);
    pVar1 = node->lvp;
    ppVar4->r = node->r;
    ppVar4->lvp = pVar1;
LAB_006c78c0:
    ppVar4->type = pVar5;
    *(undefined4 *)&ppVar4->field_0x4 = uVar6;
    *(undefined4 *)&ppVar4->l = uVar7;
    *(undefined4 *)((long)&ppVar4->l + 4) = uVar8;
    ppVar3 = parser_ast_dup(my_parser,node->l,move);
    ppVar4->l = ppVar3;
LAB_006c78fc:
    ppVar3 = parser_ast_dup(my_parser,node->r,move);
    ppVar4->r = ppVar3;
    break;
  case PARSER_F3:
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar4[1].l;
    uVar6 = *(undefined4 *)&node->field_0x24;
    ppVar4->rip = node->rip;
    *(undefined4 *)&ppVar4->field_0x24 = uVar6;
    pVar5 = node->type;
    uVar6 = *(undefined4 *)&node->field_0x4;
    ppVar3 = node->l;
    pVar1 = node->lvp;
    ppVar4->r = node->r;
    ppVar4->lvp = pVar1;
    ppVar4->type = pVar5;
    *(undefined4 *)&ppVar4->field_0x4 = uVar6;
    ppVar4->l = ppVar3;
    ppVar3 = parser_ast_dup(my_parser,node->l,move);
    ppVar4->l = ppVar3;
    ppVar3 = parser_ast_dup(my_parser,node->r,move);
    ppVar4->r = ppVar3;
    ppVar3 = parser_ast_dup(my_parser,(node->lvp).n,move);
    (ppVar4->lvp).n = ppVar3;
    break;
  case PARSER_ASSIGN:
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar4->rip;
    ppVar4->r = node->r;
    pVar5 = node->type;
    uVar6 = *(undefined4 *)&node->field_0x4;
    uVar7 = *(undefined4 *)&node->l;
    uVar8 = *(undefined4 *)((long)&node->l + 4);
    goto LAB_006c78c0;
  case PARSER_ADD_VP:
  case PARSER_SUB_VP:
  case PARSER_MUL_VP:
  case PARSER_DIV_VP:
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar4[1].l;
    uVar6 = *(undefined4 *)&node->field_0x24;
    ppVar4->rip = node->rip;
    *(undefined4 *)&ppVar4->field_0x24 = uVar6;
    pVar5 = node->type;
    uVar6 = *(undefined4 *)&node->field_0x4;
    ppVar3 = node->l;
    pVar1 = node->lvp;
    ppVar4->r = node->r;
    ppVar4->lvp = pVar1;
    ppVar4->type = pVar5;
    *(undefined4 *)&ppVar4->field_0x4 = uVar6;
    ppVar4->l = ppVar3;
    goto LAB_006c78fc;
  case PARSER_NEG_P:
    ppVar4 = (parser_node *)my_parser->p_free;
    my_parser->p_free = &ppVar4[1].l;
    uVar6 = *(undefined4 *)&node->field_0x24;
    ppVar4->rip = node->rip;
    *(undefined4 *)&ppVar4->field_0x24 = uVar6;
    pVar5 = node->type;
    uVar6 = *(undefined4 *)&node->field_0x4;
    uVar7 = *(undefined4 *)&node->l;
    uVar8 = *(undefined4 *)((long)&node->l + 4);
    pVar1 = node->lvp;
    ppVar4->r = node->r;
    ppVar4->lvp = pVar1;
LAB_006c7a3d:
    ppVar4->type = pVar5;
    *(undefined4 *)&ppVar4->field_0x4 = uVar6;
    *(undefined4 *)&ppVar4->l = uVar7;
    *(undefined4 *)((long)&ppVar4->l + 4) = uVar8;
    ppVar3 = parser_ast_dup(my_parser,node->l,move);
    ppVar4->l = ppVar3;
    break;
  default:
    std::__cxx11::to_string(&local_40,node->type);
    std::operator+(&local_60,"parser_ast_dup: unknown node type ",&local_40);
    Abort(&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    ppVar4 = (parser_node *)0x0;
  }
  if (move != 0) {
    if (node->type == PARSER_SYMBOL) {
      free(node->l);
    }
    free(node);
  }
  return ppVar4;
}

Assistant:

struct parser_node*
parser_ast_dup (struct amrex_parser* my_parser, struct parser_node* node, int move)
{
    void* result = nullptr;

    switch (node->type)
    {
    case PARSER_NUMBER:
        result = parser_allocate(my_parser, sizeof(struct parser_number));
        std::memcpy(result, node          , sizeof(struct parser_number));
        break;
    case PARSER_SYMBOL:
        result = parser_allocate(my_parser, sizeof(struct parser_symbol));
        std::memcpy(result, node          , sizeof(struct parser_symbol));
        ((struct parser_symbol*)result)->name = (char*) parser_allocate
            (my_parser, std::strlen(((struct parser_symbol*)node)->name)+1);
        std::strcpy(((struct parser_symbol*)result)->name,
                    ((struct parser_symbol*)node  )->name);
        break;
    case PARSER_ADD:
    case PARSER_SUB:
    case PARSER_MUL:
    case PARSER_DIV:
    case PARSER_ADD_PP:
    case PARSER_SUB_PP:
    case PARSER_MUL_PP:
    case PARSER_DIV_PP:
    case PARSER_LIST:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->l = parser_ast_dup(my_parser, node->l, move);
        ((struct parser_node*)result)->r = parser_ast_dup(my_parser, node->r, move);
        break;
    case PARSER_NEG:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->l = parser_ast_dup(my_parser, node->l, move);
        ((struct parser_node*)result)->r = nullptr;
        break;
    case PARSER_F1:
        result = parser_allocate(my_parser, sizeof(struct parser_f1));
        std::memcpy(result, node          , sizeof(struct parser_f1));
        ((struct parser_f1*)result)->l = parser_ast_dup(my_parser,
                                                 ((struct parser_f1*)node)->l, move);
        break;
    case PARSER_F2:
        result = parser_allocate(my_parser, sizeof(struct parser_f2));
        std::memcpy(result, node          , sizeof(struct parser_f2));
        ((struct parser_f2*)result)->l = parser_ast_dup(my_parser,
                                                 ((struct parser_f2*)node)->l, move);
        ((struct parser_f2*)result)->r = parser_ast_dup(my_parser,
                                                 ((struct parser_f2*)node)->r, move);
        break;
    case PARSER_F3:
        result = parser_allocate(my_parser, sizeof(struct parser_f3));
        std::memcpy(result, node          , sizeof(struct parser_f3));
        ((struct parser_f3*)result)->n1 = parser_ast_dup(my_parser,
                                                 ((struct parser_f3*)node)->n1, move);
        ((struct parser_f3*)result)->n2 = parser_ast_dup(my_parser,
                                                 ((struct parser_f3*)node)->n2, move);
        ((struct parser_f3*)result)->n3 = parser_ast_dup(my_parser,
                                                 ((struct parser_f3*)node)->n3, move);
        break;
    case PARSER_ASSIGN:
        result = parser_allocate(my_parser, sizeof(struct parser_assign));
        std::memcpy(result, node          , sizeof(struct parser_assign));
        ((struct parser_assign*)result)->s = (struct parser_symbol*)
            parser_ast_dup(my_parser, (struct parser_node*)
                                                (((struct parser_assign*)node)->s), move);
        ((struct parser_assign*)result)->v = parser_ast_dup(my_parser,
                                                 ((struct parser_assign*)node)->v, move);
        break;
    case PARSER_ADD_VP:
    case PARSER_SUB_VP:
    case PARSER_MUL_VP:
    case PARSER_DIV_VP:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->r = parser_ast_dup(my_parser, node->r, move);
        break;
    case PARSER_NEG_P:
        result = parser_allocate(my_parser, sizeof(struct parser_node));
        std::memcpy(result, node          , sizeof(struct parser_node));
        ((struct parser_node*)result)->l = parser_ast_dup(my_parser, node->l, move);
        break;
    default:
        amrex::Abort("parser_ast_dup: unknown node type " + std::to_string(node->type));
    }
    if (move) {
        /* Note that we only do this on the original AST.  We do not
         * need to call free for AST stored in amrex_parser because the
         * memory is not allocated with std::malloc directly.
         */
        if (node->type == PARSER_SYMBOL) {
            std::free(((struct parser_symbol*)node)->name);
        }
        std::free((void*)node);
    }
    return (struct parser_node*)result;
}